

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

char * stb_shorten_path_readable(char *path,int len)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  
  sVar3 = strlen(path);
  iVar4 = (int)sVar3;
  if (len < 0x401 && len < iVar4) {
    pcVar9 = (char *)0x0;
    cVar2 = *path;
    pcVar8 = path;
    while (cVar2 != '\0') {
      if (cVar2 == '\\') {
        pcVar9 = pcVar8;
      }
      if (cVar2 == '/') {
        pcVar9 = pcVar8;
      }
      pcVar1 = pcVar8 + 1;
      pcVar8 = pcVar8 + 1;
      cVar2 = *pcVar1;
    }
    iVar10 = ((int)pcVar9 - (int)path) + 1;
    if (pcVar9 == (char *)0x0) {
      iVar10 = 0;
    }
    pcVar8 = pcVar9 + 1;
    if (pcVar9 == (char *)0x0) {
      pcVar8 = path;
    }
    iVar11 = iVar4 - iVar10;
    if (iVar10 < len >> 1) {
      iVar4 = len - iVar10;
      iVar6 = iVar10;
    }
    else if (iVar11 < len >> 1) {
      iVar6 = len - iVar11;
      iVar4 = iVar11;
    }
    else {
      iVar7 = (iVar10 * len) / iVar4;
      iVar5 = len >> 2;
      iVar6 = iVar7;
      if (iVar7 <= iVar5) {
        iVar6 = iVar5;
      }
      iVar4 = (iVar11 * len) / iVar4;
      if (iVar7 < iVar5) {
        iVar4 = len - iVar5;
      }
      if (iVar4 < iVar5) {
        iVar6 = len - iVar5;
      }
      if (iVar4 <= iVar5) {
        iVar4 = iVar5;
      }
    }
    if ((iVar10 < iVar6) || (iVar11 < iVar4)) {
      __assert_fail("r1 <= n1 && r2 <= n2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x8fc,"char *stb_shorten_path_readable(char *, int)");
    }
    if (iVar10 != 0) {
      if (iVar6 < iVar10) {
        iVar5 = iVar6 - (iVar6 >> 1);
        lVar12 = (long)(iVar6 >> 1);
        memcpy(stb_shorten_path_readable::buffer,path,lVar12 - 1);
        pcVar9 = stb_shorten_path_readable::buffer + lVar12 + 1;
        *(undefined2 *)((long)&stb__strcmpoffset + lVar12 + 3) = 0x2e2e;
        path = path + ((long)iVar10 - (long)iVar5) + 1;
        iVar10 = iVar5 + -1;
      }
      else {
        pcVar9 = stb_shorten_path_readable::buffer;
      }
      memcpy(pcVar9,path,(long)iVar10);
    }
    path = stb_shorten_path_readable::buffer;
    pcVar9 = stb_shorten_path_readable::buffer + iVar6;
    if (iVar4 < iVar11) {
      iVar10 = iVar4 - (iVar4 >> 1);
      lVar12 = (long)(iVar4 >> 1);
      memcpy(pcVar9,pcVar8,lVar12 - 1);
      (pcVar9 + lVar12 + -1)[0] = '.';
      (pcVar9 + lVar12 + -1)[1] = '.';
      pcVar8 = pcVar8 + ((long)iVar11 - (long)iVar10) + 1;
      iVar11 = iVar10 + -1;
      pcVar9 = pcVar9 + lVar12 + 1;
    }
    memcpy(pcVar9,pcVar8,(long)iVar11);
    stb_shorten_path_readable::buffer[len] = '\0';
  }
  return path;
}

Assistant:

char * stb_shorten_path_readable(char *path, int len)
{
   static char buffer[1024];
   int n = strlen(path),n1,n2,r1,r2;
   char *s;
   if (n <= len) return path;
   if (len > 1024) return path;
   s = stb_strrchr2(path, '/', '\\');
   if (s) {
      n1 = s - path + 1;
      n2 = n - n1;
      ++s;
   } else {
      n1 = 0;
      n2 = n;
      s = path;
   }
   // now we need to reduce r1 and r2 so that they fit in len
   if (n1 < len>>1) {
      r1 = n1;
      r2 = len - r1;
   } else if (n2 < len >> 1) {
      r2 = n2;
      r1 = len - r2;
   } else {
      r1 = n1 * len / n;
      r2 = n2 * len / n;
      if (r1 < len>>2) r1 = len>>2, r2 = len-r1;
      if (r2 < len>>2) r2 = len>>2, r1 = len-r2;
   }
   assert(r1 <= n1 && r2 <= n2);
   if (n1)
      stb__add_section(buffer, path, n1, r1);
   stb__add_section(buffer+r1, s, n2, r2);
   buffer[len] = 0;
   return buffer;
}